

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_cast_expression.cpp
# Opt level: O2

bool __thiscall duckdb::BoundCastExpression::CanThrow(BoundCastExpression *this)

{
  bool bVar1;
  pointer pEVar2;
  LogicalTypeId LVar3;
  bool changes_type;
  LogicalType child_type;
  LogicalType local_68;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  LogicalType local_30;
  
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (&this->child);
  LogicalType::LogicalType(&local_30,&pEVar2->return_type);
  if ((this->super_Expression).return_type.id_ != local_30.id_) {
    LogicalType::ForceMaxLogicalType
              ((LogicalType *)&local_50,&(this->super_Expression).return_type,&local_30);
    LogicalType::LogicalType(&local_68,local_30.id_);
    bVar1 = LogicalType::operator==((LogicalType *)&local_50,&local_68);
    LogicalType::~LogicalType(&local_68);
    LogicalType::~LogicalType((LogicalType *)&local_50);
    LVar3 = SQLNULL;
    if (bVar1) goto LAB_005b9a17;
  }
  local_68.id_ = INVALID;
  local_50._8_8_ = 0;
  local_38 = ::std::
             _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression/bound_cast_expression.cpp:228:47)>
             ::_M_invoke;
  local_40 = ::std::
             _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression/bound_cast_expression.cpp:228:47)>
             ::_M_manager;
  local_50._M_unused._M_object = &local_68;
  ExpressionIterator::EnumerateChildren
            (&this->super_Expression,(function<void_(const_duckdb::Expression_&)> *)&local_50);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_50);
  LVar3 = local_68.id_;
LAB_005b9a17:
  LogicalType::~LogicalType(&local_30);
  return (bool)LVar3;
}

Assistant:

bool BoundCastExpression::CanThrow() const {
	const auto child_type = child->return_type;
	if (return_type.id() != child_type.id() &&
	    LogicalType::ForceMaxLogicalType(return_type, child_type) == child_type.id()) {
		return true;
	}
	bool changes_type = false;
	ExpressionIterator::EnumerateChildren(*this, [&](const Expression &child) { changes_type |= child.CanThrow(); });
	return changes_type;
}